

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool anon_unknown.dwarf_42920::UpdateOptionsFromCommandLine(Options *options,int argc,char **argv)

{
  _Alloc_hider _Var1;
  char cVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  ctype *pcVar6;
  invalid_argument *piVar7;
  size_type sVar8;
  int iVar9;
  long lVar10;
  Options *this;
  int iVar11;
  ulong uVar12;
  size_type sVar13;
  long lVar14;
  bool bVar15;
  string arg;
  string local_f8;
  locale local_d8 [8];
  pointer local_d0;
  locale local_c8 [8];
  string local_c0;
  int local_9c;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  uint local_6c;
  char **local_68;
  ulong local_60;
  Options *local_58;
  Options *local_50;
  Options *local_48;
  Options *local_40;
  Options *local_38;
  
  local_58 = options;
  if (1 < argc) {
    local_50 = (Options *)&options->AppSpace;
    local_48 = (Options *)&options->EnvironmentBlendMode;
    local_40 = (Options *)&options->ViewConfiguration;
    local_38 = (Options *)&options->FormFactor;
    uVar12 = 1;
    local_9c = argc;
    local_68 = argv;
    do {
      std::__cxx11::string::string((string *)&local_98,argv[(int)uVar12],(allocator *)&local_f8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--graphics","");
      local_60 = uVar12;
      std::locale::locale(local_d8);
      pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
      sVar8 = local_98._M_string_length;
      if (local_98._M_string_length == local_f8._M_string_length) {
        bVar4 = true;
        if (local_98._M_string_length != 0) {
          local_d0 = local_98._M_dataplus._M_p;
          local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_f8._M_dataplus._M_p;
          sVar13 = 0;
          do {
            cVar3 = local_78->_M_local_buf[sVar13];
            cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar13]);
            cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
            if (cVar2 != cVar3) goto LAB_0010a2fd;
            sVar13 = sVar13 + 1;
          } while (sVar8 != sVar13);
        }
      }
      else {
LAB_0010a2fd:
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-g","");
        std::locale::locale(local_c8);
        pcVar6 = std::use_facet<std::ctype<char>>(local_c8);
        _Var1._M_p = local_c0._M_dataplus._M_p;
        if (local_98._M_string_length == local_c0._M_string_length) {
          if (local_98._M_string_length == 0) {
            bVar4 = true;
          }
          else {
            local_d0 = local_98._M_dataplus._M_p;
            lVar14 = local_98._M_string_length - 1;
            lVar10 = 0;
            do {
              cVar3 = _Var1._M_p[lVar10];
              cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[lVar10]);
              cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
              bVar4 = cVar2 == cVar3;
              if (!bVar4) break;
              bVar15 = lVar14 != lVar10;
              lVar10 = lVar10 + 1;
            } while (bVar15);
          }
        }
        else {
          bVar4 = false;
        }
        std::locale::~locale(local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      std::locale::~locale(local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      argv = local_68;
      iVar9 = local_9c;
      uVar5 = (int)local_60 + 1;
      if (bVar4) {
        if (local_9c <= (int)uVar5) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar7,"Argument parameter missing");
          __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::string
                  ((string *)&local_f8,local_68[(int)uVar5],(allocator *)&local_c0);
        iVar11 = (int)local_60;
        this = local_58;
LAB_0010abb5:
        std::__cxx11::string::operator=((string *)this,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        uVar5 = iVar11 + 2;
      }
      else {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_6c = uVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--formfactor","");
        std::locale::locale(local_d8);
        pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
        sVar8 = local_98._M_string_length;
        if (local_98._M_string_length == local_f8._M_string_length) {
          bVar4 = true;
          if (local_98._M_string_length != 0) {
            local_d0 = local_98._M_dataplus._M_p;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_f8._M_dataplus._M_p;
            sVar13 = 0;
            do {
              cVar3 = local_78->_M_local_buf[sVar13];
              cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar13]);
              cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
              if (cVar2 != cVar3) goto LAB_0010a4e5;
              sVar13 = sVar13 + 1;
            } while (sVar8 != sVar13);
          }
        }
        else {
LAB_0010a4e5:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-ff","");
          std::locale::locale(local_c8);
          pcVar6 = std::use_facet<std::ctype<char>>(local_c8);
          _Var1._M_p = local_c0._M_dataplus._M_p;
          if (local_98._M_string_length == local_c0._M_string_length) {
            if (local_98._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              local_d0 = local_98._M_dataplus._M_p;
              lVar14 = local_98._M_string_length - 1;
              lVar10 = 0;
              do {
                cVar3 = _Var1._M_p[lVar10];
                cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[lVar10]);
                cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
                bVar4 = cVar2 == cVar3;
                if (!bVar4) break;
                bVar15 = lVar14 != lVar10;
                lVar10 = lVar10 + 1;
              } while (bVar15);
            }
          }
          else {
            bVar4 = false;
          }
          std::locale::~locale(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        std::locale::~locale(local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        argv = local_68;
        iVar9 = local_9c;
        if (bVar4) {
          iVar11 = (int)local_60;
          if (local_9c <= (int)local_6c) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Argument parameter missing");
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_f8,local_68[(int)local_6c],(allocator *)&local_c0);
          this = local_38;
          goto LAB_0010abb5;
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--viewconfig","");
        std::locale::locale(local_d8);
        pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
        sVar8 = local_98._M_string_length;
        if (local_98._M_string_length == local_f8._M_string_length) {
          bVar4 = true;
          if (local_98._M_string_length != 0) {
            local_d0 = local_98._M_dataplus._M_p;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_f8._M_dataplus._M_p;
            sVar13 = 0;
            do {
              cVar3 = local_78->_M_local_buf[sVar13];
              cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar13]);
              cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
              if (cVar2 != cVar3) goto LAB_0010a6c1;
              sVar13 = sVar13 + 1;
            } while (sVar8 != sVar13);
          }
        }
        else {
LAB_0010a6c1:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-vc","");
          std::locale::locale(local_c8);
          pcVar6 = std::use_facet<std::ctype<char>>(local_c8);
          _Var1._M_p = local_c0._M_dataplus._M_p;
          if (local_98._M_string_length == local_c0._M_string_length) {
            if (local_98._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              local_d0 = local_98._M_dataplus._M_p;
              lVar14 = local_98._M_string_length - 1;
              lVar10 = 0;
              do {
                cVar3 = _Var1._M_p[lVar10];
                cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[lVar10]);
                cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
                bVar4 = cVar2 == cVar3;
                if (!bVar4) break;
                bVar15 = lVar14 != lVar10;
                lVar10 = lVar10 + 1;
              } while (bVar15);
            }
          }
          else {
            bVar4 = false;
          }
          std::locale::~locale(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        std::locale::~locale(local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        argv = local_68;
        iVar9 = local_9c;
        if (bVar4) {
          iVar11 = (int)local_60;
          if (local_9c <= (int)local_6c) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Argument parameter missing");
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_f8,local_68[(int)local_6c],(allocator *)&local_c0);
          this = local_40;
          goto LAB_0010abb5;
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--blendmode","");
        std::locale::locale(local_d8);
        pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
        sVar8 = local_98._M_string_length;
        if (local_98._M_string_length == local_f8._M_string_length) {
          bVar4 = true;
          if (local_98._M_string_length != 0) {
            local_d0 = local_98._M_dataplus._M_p;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_f8._M_dataplus._M_p;
            sVar13 = 0;
            do {
              cVar3 = local_78->_M_local_buf[sVar13];
              cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar13]);
              cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
              if (cVar2 != cVar3) goto LAB_0010a89d;
              sVar13 = sVar13 + 1;
            } while (sVar8 != sVar13);
          }
        }
        else {
LAB_0010a89d:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-bm","");
          std::locale::locale(local_c8);
          pcVar6 = std::use_facet<std::ctype<char>>(local_c8);
          _Var1._M_p = local_c0._M_dataplus._M_p;
          if (local_98._M_string_length == local_c0._M_string_length) {
            if (local_98._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              local_d0 = local_98._M_dataplus._M_p;
              lVar14 = local_98._M_string_length - 1;
              lVar10 = 0;
              do {
                cVar3 = _Var1._M_p[lVar10];
                cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[lVar10]);
                cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
                bVar4 = cVar2 == cVar3;
                if (!bVar4) break;
                bVar15 = lVar14 != lVar10;
                lVar10 = lVar10 + 1;
              } while (bVar15);
            }
          }
          else {
            bVar4 = false;
          }
          std::locale::~locale(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        std::locale::~locale(local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        argv = local_68;
        iVar9 = local_9c;
        if (bVar4) {
          iVar11 = (int)local_60;
          if (local_9c <= (int)local_6c) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Argument parameter missing");
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_f8,local_68[(int)local_6c],(allocator *)&local_c0);
          this = local_48;
          goto LAB_0010abb5;
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--space","");
        std::locale::locale(local_d8);
        pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
        sVar8 = local_98._M_string_length;
        if (local_98._M_string_length == local_f8._M_string_length) {
          bVar4 = true;
          if (local_98._M_string_length != 0) {
            local_d0 = local_98._M_dataplus._M_p;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_f8._M_dataplus._M_p;
            sVar13 = 0;
            do {
              cVar3 = local_78->_M_local_buf[sVar13];
              cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar13]);
              cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
              if (cVar2 != cVar3) goto LAB_0010aa79;
              sVar13 = sVar13 + 1;
            } while (sVar8 != sVar13);
          }
        }
        else {
LAB_0010aa79:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-s","");
          std::locale::locale(local_c8);
          pcVar6 = std::use_facet<std::ctype<char>>(local_c8);
          _Var1._M_p = local_c0._M_dataplus._M_p;
          if (local_98._M_string_length == local_c0._M_string_length) {
            if (local_98._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              local_d0 = local_98._M_dataplus._M_p;
              lVar14 = local_98._M_string_length - 1;
              lVar10 = 0;
              do {
                cVar3 = _Var1._M_p[lVar10];
                cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[lVar10]);
                cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
                bVar4 = cVar2 == cVar3;
                if (!bVar4) break;
                bVar15 = lVar14 != lVar10;
                lVar10 = lVar10 + 1;
              } while (bVar15);
            }
          }
          else {
            bVar4 = false;
          }
          std::locale::~locale(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        std::locale::~locale(local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        argv = local_68;
        iVar9 = local_9c;
        if (bVar4) {
          if (local_9c <= (int)local_6c) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Argument parameter missing");
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_f8,local_68[(int)local_6c],(allocator *)&local_c0);
          iVar11 = (int)local_60;
          this = local_50;
          goto LAB_0010abb5;
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--verbose","");
        std::locale::locale(local_d8);
        pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
        sVar8 = local_98._M_string_length;
        if (local_98._M_string_length == local_f8._M_string_length) {
          bVar4 = true;
          if (local_98._M_string_length != 0) {
            local_d0 = local_98._M_dataplus._M_p;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_f8._M_dataplus._M_p;
            sVar13 = 0;
            do {
              cVar3 = local_78->_M_local_buf[sVar13];
              cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar13]);
              cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
              if (cVar2 != cVar3) goto LAB_0010aca0;
              sVar13 = sVar13 + 1;
            } while (sVar8 != sVar13);
          }
        }
        else {
LAB_0010aca0:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-v","");
          std::locale::locale(local_c8);
          pcVar6 = std::use_facet<std::ctype<char>>(local_c8);
          _Var1._M_p = local_c0._M_dataplus._M_p;
          if (local_98._M_string_length == local_c0._M_string_length) {
            if (local_98._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              local_d0 = local_98._M_dataplus._M_p;
              lVar14 = local_98._M_string_length - 1;
              lVar10 = 0;
              do {
                cVar3 = _Var1._M_p[lVar10];
                cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[lVar10]);
                cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
                bVar4 = cVar2 == cVar3;
                if (!bVar4) break;
                bVar15 = lVar14 != lVar10;
                lVar10 = lVar10 + 1;
              } while (bVar15);
            }
          }
          else {
            bVar4 = false;
          }
          std::locale::~locale(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        argv = local_68;
        iVar9 = local_9c;
        std::locale::~locale(local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--help","");
          std::locale::locale(local_d8);
          pcVar6 = std::use_facet<std::ctype<char>>(local_d8);
          _Var1._M_p = local_f8._M_dataplus._M_p;
          if (local_98._M_string_length != local_f8._M_string_length) goto LAB_0010aed3;
          bVar4 = true;
          if (local_98._M_string_length == 0) goto LAB_0010af46;
          local_d0 = local_98._M_dataplus._M_p;
          sVar8 = 0;
          goto LAB_0010ae96;
        }
        Log::SetLevel(Verbose);
        uVar5 = local_6c;
      }
      uVar12 = (ulong)uVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    } while ((int)uVar5 < iVar9);
  }
  if ((local_58->GraphicsPlugin)._M_string_length == 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"GraphicsPlugin parameter is required","");
    Log::Write(Error,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    ShowHelp();
    return false;
  }
  Options::ParseStrings(local_58);
  return true;
LAB_0010aed3:
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-h","");
  std::locale::locale(local_c8);
  bVar4 = EqualsIgnoreCase(&local_98,&local_c0,local_c8);
  std::locale::~locale(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  goto LAB_0010af46;
  while (sVar8 = sVar8 + 1, local_98._M_string_length != sVar8) {
LAB_0010ae96:
    cVar3 = _Var1._M_p[sVar8];
    cVar2 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_d0[sVar8]);
    cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar3);
    if (cVar2 != cVar3) goto LAB_0010aed3;
  }
  bVar4 = true;
LAB_0010af46:
  std::locale::~locale(local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    ShowHelp();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  Fmt_abi_cxx11_(&local_f8,"Unknown argument: %s",local_98._M_dataplus._M_p);
  std::invalid_argument::invalid_argument(piVar7,(string *)&local_f8);
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool UpdateOptionsFromCommandLine(Options& options, int argc, char* argv[]) {
    int i = 1;  // Index 0 is the program name and is skipped.

    auto getNextArg = [&] {
        if (i >= argc) {
            throw std::invalid_argument("Argument parameter missing");
        }

        return std::string(argv[i++]);
    };

    while (i < argc) {
        const std::string arg = getNextArg();
        if (EqualsIgnoreCase(arg, "--graphics") || EqualsIgnoreCase(arg, "-g")) {
            options.GraphicsPlugin = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--formfactor") || EqualsIgnoreCase(arg, "-ff")) {
            options.FormFactor = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--viewconfig") || EqualsIgnoreCase(arg, "-vc")) {
            options.ViewConfiguration = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--blendmode") || EqualsIgnoreCase(arg, "-bm")) {
            options.EnvironmentBlendMode = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--space") || EqualsIgnoreCase(arg, "-s")) {
            options.AppSpace = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--verbose") || EqualsIgnoreCase(arg, "-v")) {
            Log::SetLevel(Log::Level::Verbose);
        } else if (EqualsIgnoreCase(arg, "--help") || EqualsIgnoreCase(arg, "-h")) {
            ShowHelp();
            return false;
        } else {
            throw std::invalid_argument(Fmt("Unknown argument: %s", arg.c_str()));
        }
    }

    // Check for required parameters.
    if (options.GraphicsPlugin.empty()) {
        Log::Write(Log::Level::Error, "GraphicsPlugin parameter is required");
        ShowHelp();
        return false;
    }

    try {
        options.ParseStrings();
    } catch (std::invalid_argument& ia) {
        Log::Write(Log::Level::Error, ia.what());
        ShowHelp();
        return false;
    }
    return true;
}